

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

TextMarkerGenerator * google::protobuf::TextMarkerGenerator::CreateRandom(void)

{
  string_view redaction_marker;
  result_type __sd;
  size_type __b;
  TextMarkerGenerator *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> random_marker;
  Duration t;
  uniform_int_distribution<unsigned_long> local_a30;
  result_type local_a20;
  size_t random_marker_size;
  result_type local_a08;
  size_t redaction_marker_index;
  uint32_t local_9f8;
  Duration local_9f0;
  HiRep local_9dc;
  uint32_t local_9d4;
  undefined1 local_9d0 [8];
  mt19937_64 random;
  
  t = (Duration)absl::lts_20250127::Now();
  local_9f0.rep_hi_ = t.rep_hi_;
  local_9dc = local_9f0.rep_hi_;
  local_9f0.rep_lo_ = t.rep_lo_;
  local_9d4 = local_9f0.rep_lo_;
  redaction_marker_index._0_4_ = local_9f0.rep_hi_.lo_;
  redaction_marker_index._4_4_ = local_9f0.rep_hi_.hi_;
  local_9f8 = local_9f0.rep_lo_;
  local_9f0 = t;
  __sd = absl::lts_20250127::ToUnixMicros((Time)t);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_9d0,__sd);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&random_marker_size,0,2);
  local_a08 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&random_marker_size,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_9d0);
  __b = std::basic_string_view<char,_std::char_traits<char>_>::size(&kRandomMarker);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution(&local_a30,1,__b);
  local_a20 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_a30,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_9d0);
  redaction_marker = kRedactionMarkers[local_a08];
  random_marker =
       std::basic_string_view<char,_std::char_traits<char>_>::substr(&kRandomMarker,0,local_a20);
  TextMarkerGenerator(in_RDI,redaction_marker,random_marker);
  return in_RDI;
}

Assistant:

TextMarkerGenerator TextMarkerGenerator::CreateRandom() {
  // We avoid using sources backed by system entropy to allow the marker
  // generator to work in sandboxed environments that have no access to syscalls
  // such as getrandom or getpid. Note that this randomization has no security
  // implications, it's only used to break code that attempts to deserialize
  // debug strings.
  std::mt19937_64 random{
      static_cast<uint64_t>(absl::ToUnixMicros(absl::Now()))};

  size_t redaction_marker_index = std::uniform_int_distribution<size_t>{
      0, ABSL_ARRAYSIZE(kRedactionMarkers) - 1}(random);

  size_t random_marker_size =
      std::uniform_int_distribution<size_t>{1, kRandomMarker.size()}(random);

  return TextMarkerGenerator(kRedactionMarkers[redaction_marker_index],
                             kRandomMarker.substr(0, random_marker_size));
}